

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

void __thiscall chaiscript::eval::Noop_AST_Node::Noop_AST_Node(Noop_AST_Node *this)

{
  allocator local_9a;
  allocator local_99;
  string local_98 [32];
  undefined1 local_78 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  string local_58;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  local_38;
  
  std::__cxx11::string::string((string *)&local_58,"",&local_99);
  std::__cxx11::string::string(local_98,"",&local_9a);
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  std::make_shared<std::__cxx11::string,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_78 + 0x10))
  ;
  local_38.
  super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AST_Node::AST_Node(&this->super_AST_Node,&local_58,0x38,(Parse_Location *)local_78,&local_38);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::~vector(&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)&local_58);
  (this->super_AST_Node)._vptr_AST_Node = (_func_int **)&PTR_pretty_print_abi_cxx11__0031f520;
  const_var((chaiscript *)&this->m_value,true);
  return;
}

Assistant:

Noop_AST_Node() :
          AST_Node("", AST_Node_Type::Noop, Parse_Location()),
          m_value(const_var(true))
        { }